

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

bool __thiscall QFileSystemModel::isDir(QFileSystemModel *this,QModelIndex *index)

{
  Type TVar1;
  quintptr qVar2;
  long in_FS_OFFSET;
  undefined1 uVar3;
  QFileInfo local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 1;
  if (((-1 < index->r) && (-1 < index->c)) && ((index->m).ptr != (QAbstractItemModel *)0x0)) {
    if ((index->m).ptr == (QAbstractItemModel *)0x0) {
      qVar2 = *(long *)&this->field_0x8 + 0x138;
    }
    else {
      qVar2 = index->i;
    }
    if (*(QExtendedInformation **)(qVar2 + 0x38) == (QExtendedInformation *)0x0) {
      fileInfo((QFileSystemModel *)local_20,(QModelIndex *)this);
      uVar3 = QFileInfo::isDir();
      QFileInfo::~QFileInfo(local_20);
    }
    else {
      TVar1 = QExtendedInformation::type(*(QExtendedInformation **)(qVar2 + 0x38));
      uVar3 = TVar1 == Dir;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::isDir(const QModelIndex &index) const
{
    // This function is for public usage only because it could create a file info
    Q_D(const QFileSystemModel);
    if (!index.isValid())
        return true;
    QFileSystemModelPrivate::QFileSystemNode *n = d->node(index);
    if (n->hasInformation())
        return n->isDir();
    return fileInfo(index).isDir();
}